

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

chunk * cave_generate(player *p,wchar_t height,wchar_t width)

{
  undefined2 uVar1;
  quest *pqVar2;
  _Bool _Var3;
  uint32_t uVar4;
  wchar_t wVar5;
  uint32_t y;
  uint uVar6;
  dun_data *pdVar7;
  chunk_conflict2 *pcVar8;
  object **ppoVar9;
  ulong uVar10;
  loc *plVar11;
  int *piVar12;
  loc **pplVar13;
  level *plVar14;
  chunk_conflict *pcVar15;
  connector *pcVar16;
  cave_profile *pcVar17;
  angband_constants *paVar18;
  loc lVar19;
  square *psVar20;
  connector *pcVar21;
  feature *pfVar22;
  bitflag *pbVar23;
  char cVar24;
  int iVar25;
  byte bVar26;
  uint16_t uVar27;
  ushort uVar28;
  wchar_t i;
  wchar_t wVar29;
  uint uVar30;
  connector **ppcVar31;
  char *pcVar32;
  dun_data *dd;
  cave_profile *pcVar33;
  wchar_t n;
  long lVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  char *error;
  uint local_114;
  wchar_t local_110;
  wchar_t local_10c;
  loc grid;
  dun_data dun_body;
  
  error = "no generation";
  if (p->upkeep->arena_level == false) {
    pdVar7 = (dun_data *)0x0;
    uVar30 = 0;
    local_110 = height;
    local_10c = width;
    while ((uVar30 < 100 && (error != (char *)0x0))) {
      error = (char *)0x0;
      character_dungeon = false;
      dun = &dun_body;
      local_114 = uVar30;
      plVar11 = (loc *)mem_zalloc((ulong)z_info->level_room_max << 3);
      dun->cent = plVar11;
      piVar12 = (int *)mem_zalloc((ulong)z_info->level_room_max << 2);
      dun->ent_n = piVar12;
      pplVar13 = (loc **)mem_zalloc((ulong)z_info->level_room_max << 3);
      pdVar7 = dun;
      dun->ent = pplVar13;
      pdVar7->ent2room = (int **)0x0;
      plVar11 = (loc *)mem_zalloc((ulong)z_info->level_door_max << 3);
      dun->door = plVar11;
      plVar11 = (loc *)mem_zalloc((ulong)z_info->wall_pierce_max << 3);
      dun->wall = plVar11;
      plVar11 = (loc *)mem_zalloc((ulong)z_info->tunn_grid_max << 3);
      pdVar7 = dun;
      dun->tunn = plVar11;
      pdVar7->one_off_below = (connector *)0x0;
      pdVar7->curr_join = (connector *)0x0;
      pdVar7->join = (connector *)0x0;
      pdVar7->one_off_above = (connector *)0x0;
      pdVar7->nstair_room = L'\0';
      _Var3 = is_quest(p,(int)p->depth);
      pdVar7 = dun;
      dun->quest = _Var3;
      if ((p->opts).opt[0x2b] == true) {
        pdVar7->persist = true;
        plVar14 = level_by_depth(p->depth + L'\xffffffff');
        if ((plVar14 == (level *)0x0) ||
           (pcVar15 = chunk_find_name(plVar14->name), pcVar15 == (chunk_conflict *)0x0)) {
          plVar14 = level_by_depth(p->depth + L'\xfffffffe');
          if ((plVar14 != (level *)0x0) &&
             (pcVar15 = chunk_find_name(plVar14->name), pcVar15 != (chunk_conflict *)0x0)) {
            ppcVar31 = &pcVar15->join;
            while (pcVar21 = *ppcVar31, pcVar21 != (connector *)0x0) {
              if (pcVar21->feat == '\x06') {
                pcVar16 = (connector *)mem_zalloc(0x20);
                pcVar16->grid = pcVar21->grid;
                pcVar16->feat = '\x06';
                pcVar16->next = pdVar7->one_off_above;
                pdVar7->one_off_above = pcVar16;
              }
              ppcVar31 = &pcVar21->next;
            }
          }
        }
        else {
          ppcVar31 = &pcVar15->join;
          while (pcVar21 = *ppcVar31, pcVar21 != (connector *)0x0) {
            if (pcVar21->feat == '\x06') {
              pcVar16 = (connector *)mem_zalloc(0x20);
              pcVar16->grid = pcVar21->grid;
              pcVar16->feat = '\x05';
              pcVar16->next = pdVar7->join;
              pdVar7->join = pcVar16;
            }
            ppcVar31 = &pcVar21->next;
          }
        }
        plVar14 = level_by_depth(p->depth + L'\x01');
        if ((plVar14 == (level *)0x0) ||
           (pcVar15 = chunk_find_name(plVar14->name), pcVar15 == (chunk_conflict *)0x0)) {
          plVar14 = level_by_depth(p->depth + L'\x02');
          if ((plVar14 != (level *)0x0) &&
             (pcVar15 = chunk_find_name(plVar14->name), pcVar15 != (chunk_conflict *)0x0)) {
            ppcVar31 = &pcVar15->join;
            while (pcVar21 = *ppcVar31, pcVar21 != (connector *)0x0) {
              if (pcVar21->feat == '\x05') {
                pcVar16 = (connector *)mem_zalloc(0x20);
                pcVar16->grid = pcVar21->grid;
                pcVar16->feat = '\x05';
                pcVar16->next = pdVar7->one_off_below;
                pdVar7->one_off_below = pcVar16;
              }
              ppcVar31 = &pcVar21->next;
            }
          }
        }
        else {
          ppcVar31 = &pcVar15->join;
          while (pcVar21 = *ppcVar31, pcVar21 != (connector *)0x0) {
            if (pcVar21->feat == '\x05') {
              pcVar16 = (connector *)mem_zalloc(0x20);
              pcVar16->grid = pcVar21->grid;
              pcVar16->feat = '\x06';
              pcVar16->next = pdVar7->join;
              pdVar7->join = pcVar16;
            }
            ppcVar31 = &pcVar21->next;
          }
        }
      }
      else {
        pdVar7->persist = false;
      }
      pcVar17 = find_cave_profile("moria");
      wVar5 = pcVar17->alloc;
      pcVar17 = find_cave_profile("labyrinth");
      wVar29 = pcVar17->alloc;
      if ((p->noscore & 0x10) == 0) {
LAB_00154589:
        pcVar32 = "town";
        if (p->depth != 0) {
          _Var3 = is_quest(p,(int)p->depth);
          pcVar32 = "classic";
          if (!_Var3) {
            uVar28 = p->depth;
            if (0xc < (short)uVar28) {
              auVar36._0_2_ = -(ushort)(uVar28 % 5 == 0);
              auVar36._2_2_ = -(ushort)(uVar28 % 5 == 0);
              auVar36._4_2_ = -(ushort)(uVar28 % 7 == 0);
              auVar36._6_2_ = -(ushort)(uVar28 % 7 == 0);
              auVar36._8_2_ = -(ushort)(uVar28 % 0xb == 0);
              auVar36._10_2_ = -(ushort)(uVar28 % 0xb == 0);
              auVar36._12_2_ = -(ushort)(uVar28 % 0xd == 0);
              auVar36._14_2_ = -(ushort)(uVar28 % 0xd == 0);
              iVar25 = movmskps(0xd,auVar36);
              uVar4 = Rand_div(100);
              if (((int)uVar4 <
                   (int)(((uint)(0x4332322132212110 >> ((byte)(iVar25 << 2) & 0x3f)) & 7) + 2 +
                        (uint)(uVar28 % 3 == 0))) &&
                 (pcVar32 = "labyrinth", wVar29 == L'\xffffffff' || L'\0' < wVar29))
              goto LAB_00154858;
            }
            uVar1 = p->depth;
            if ((0x1d < (ushort)(uVar1 - 10)) ||
               ((uVar4 = Rand_div(0x28), uVar4 != 0 ||
                (pcVar32 = "moria", wVar5 != L'\xffffffff' && wVar5 < L'\x01')))) {
              lVar34 = 0;
              pcVar17 = (cave_profile *)0x0;
              uVar4 = 0;
              paVar18 = z_info;
              for (uVar10 = 0; uVar10 < paVar18->profile_max; uVar10 = uVar10 + 1) {
                iVar25 = *(int *)((long)&cave_profiles->alloc + lVar34);
                if ((0 < iVar25) &&
                   (*(int *)((long)&cave_profiles->min_level + lVar34) <= (int)p->depth)) {
                  pcVar33 = (cave_profile *)((long)&cave_profiles->next + lVar34);
                  uVar4 = uVar4 + iVar25;
                  wVar5 = Rand_div(uVar4);
                  paVar18 = z_info;
                  if (wVar5 < pcVar33->alloc) {
                    pcVar17 = pcVar33;
                  }
                }
                lVar34 = lVar34 + 0x80;
              }
              pcVar32 = "classic";
              if (pcVar17 != (cave_profile *)0x0) goto LAB_00154875;
            }
          }
        }
LAB_00154858:
        pcVar17 = find_cave_profile(pcVar32);
        if (pcVar17 == (cave_profile *)0x0) {
          quit("Failed to find cave profile!");
          pcVar17 = (cave_profile *)0x0;
        }
      }
      else {
        grid.x = L'\0';
        grid.y = L'\0';
        p->noscore = p->noscore & 0xffef;
        _Var3 = get_string("Profile name (eg classic): ",(char *)&grid,0x1e);
        if ((!_Var3) || (pcVar17 = find_cave_profile((char *)&grid), pcVar17 == (cave_profile *)0x0)
           ) goto LAB_00154589;
      }
LAB_00154875:
      dun->profile = pcVar17;
      event_signal_string(EVENT_GEN_LEVEL_START,dun->profile->name);
      pcVar32 = (char *)p;
      pdVar7 = (dun_data *)(*dun->profile->builder)(p,local_110,local_10c,&error);
      uVar30 = local_114;
      if (pdVar7 == (dun_data *)0x0) {
        if (error == (char *)0x0) {
          error = "unspecified level builder failure";
        }
        if ((p->opts).opt[0x18] == true) {
          pcVar32 = "Generation restarted: %s.";
          msg("Generation restarted: %s.");
        }
        cleanup_dun_data((dun_data *)pcVar32);
        event_signal_flag(EVENT_GEN_LEVEL_END,false);
      }
      else {
        if (dun->quest == true) {
          for (uVar10 = 0; uVar10 < z_info->quest_max; uVar10 = uVar10 + 1) {
            pqVar2 = player->quests;
            if (*(wchar_t *)&pdVar7->field_0xc == (uint)pqVar2[uVar10].level) {
              _Var3 = flag_has_dbg((pqVar2[uVar10].race)->flags,0xb,1,"q->race->flags","RF_UNIQUE");
              if ((!_Var3) || ((pqVar2[uVar10].race)->cur_num < L'\x01')) {
                for (wVar5 = L'\0'; wVar5 < pqVar2[uVar10].max_num; wVar5 = wVar5 + L'\x01') {
                  find_empty((chunk_conflict *)pdVar7,(loc_conflict *)&grid);
                  place_new_monster((chunk *)pdVar7,(loc_conflict)grid,pqVar2[uVar10].race,true,true
                                    ,(monster_group_info)0x0,'\n');
                }
              }
            }
          }
        }
        for (wVar5 = L'\0'; wVar5 < *(wchar_t *)&pdVar7->ent; wVar5 = wVar5 + L'\x01') {
          for (wVar29 = L'\0'; wVar29 < *(wchar_t *)((long)&pdVar7->ent + 4);
              wVar29 = wVar29 + L'\x01') {
            lVar19 = (loc)loc(wVar29,wVar5);
            psVar20 = square((chunk_conflict *)pdVar7,lVar19);
            flag_off(psVar20->info,3,0xb);
            psVar20 = square((chunk_conflict *)pdVar7,lVar19);
            flag_off(psVar20->info,3,0xc);
            psVar20 = square((chunk_conflict *)pdVar7,lVar19);
            flag_off(psVar20->info,3,0xd);
            psVar20 = square((chunk_conflict *)pdVar7,lVar19);
            flag_off(psVar20->info,3,0xe);
            _Var3 = square_isstairs((chunk_conflict *)pdVar7,lVar19);
            if (_Var3) {
              pcVar21 = (connector *)mem_zalloc(0x20);
              pcVar21->grid = lVar19;
              pfVar22 = square_feat((chunk_conflict *)pdVar7,lVar19);
              pcVar21->feat = (uint8_t)pfVar22->fidx;
              pbVar23 = (bitflag *)mem_zalloc(3);
              pcVar21->info = pbVar23;
              for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
                psVar20 = square((chunk_conflict *)pdVar7,lVar19);
                pcVar21->info[lVar34] = psVar20->info[lVar34];
              }
              pcVar21->next = pdVar7->join;
              pdVar7->join = pcVar21;
            }
          }
        }
        dd = pdVar7;
        wVar5 = cave_monster_max((chunk_conflict *)pdVar7);
        uVar30 = local_114;
        if (wVar5 < (int)(uint)z_info->level_monster_max) {
          if (error != (char *)0x0) goto LAB_00154b25;
        }
        else {
          error = "too many monsters";
LAB_00154b25:
          if ((p->opts).opt[0x18] == true) {
            msg("Generation restarted: %s.");
          }
          uncreate_artifacts((chunk_conflict *)pdVar7);
          cave_clear((chunk *)pdVar7,p);
          dd = (dun_data *)0x3a;
          event_signal_flag(EVENT_GEN_LEVEL_END,false);
        }
        cleanup_dun_data(dd);
      }
      uVar30 = uVar30 + 1;
    }
    if (error != (char *)0x0) {
      quit_fmt("cave_generate() failed 100 times!");
    }
    if (p->depth != 0) {
      for (uVar30 = 0; uVar30 < z_info->feeling_total; uVar30 = uVar30 + 1) {
        iVar25 = 500;
        do {
          bVar35 = iVar25 == 0;
          iVar25 = iVar25 + -1;
          if (bVar35) goto LAB_00154c38;
          uVar4 = Rand_div(*(uint32_t *)((long)&pdVar7->ent + 4));
          y = Rand_div(*(uint32_t *)&pdVar7->ent);
          lVar19 = (loc)loc(uVar4,y);
          _Var3 = square_allowsfeel((chunk_conflict *)pdVar7,lVar19);
        } while ((!_Var3) || (_Var3 = square_isfeel((chunk_conflict *)pdVar7,lVar19), _Var3));
        psVar20 = square((chunk_conflict *)pdVar7,lVar19);
        flag_on_dbg(psVar20->info,3,8,"square(c, grid)->info","SQUARE_FEEL");
LAB_00154c38:
      }
      *(undefined2 *)&pdVar7->ent2room = 0;
    }
    uVar30 = *(uint *)&pdVar7->field_0xc;
    if (uVar30 == 0) {
      cVar24 = '\0';
      bVar26 = 0;
    }
    else {
      bVar26 = *(byte *)((long)&pdVar7->ent_n + 4);
      if ((bVar26 != 1) || (cVar24 = '\n', (p->opts).opt[0x24] == false)) {
        uVar6 = *(uint *)((long)&pdVar7->cent + 4) / uVar30;
        cVar24 = '<';
        if (((((bVar26 & uVar6 < 0x281) == 0) &&
             (((cVar24 = '\x14', uVar6 < 0x27101 && (cVar24 = '\x1e', uVar6 < 0x9c41)) &&
              (cVar24 = '(', uVar6 < 0x2711)))) &&
            (((cVar24 = '2', uVar6 < 0x9c5 && (cVar24 = '<', uVar6 < 0x281)) &&
             (cVar24 = 'F', uVar6 < 0xa1)))) &&
           ((cVar24 = 'P', uVar6 < 0x29 && (cVar24 = 'd', 10 < uVar6)))) {
          cVar24 = 'Z';
        }
      }
      uVar30 = *(uint *)&pdVar7->ent_n / uVar30;
      bVar26 = 1;
      if (((((uVar30 < 0x1b59) && (bVar26 = 2, uVar30 < 0x1195)) && (bVar26 = 3, uVar30 < 0x9c5)) &&
          ((bVar26 = 4, uVar30 < 0x5dd && (bVar26 = 5, uVar30 < 0x321)))) &&
         ((bVar26 = 6, uVar30 < 0x191 && (bVar26 = 7, uVar30 < 0x97)))) {
        bVar26 = 0x32 < uVar30 ^ 9;
      }
    }
    *(byte *)&pdVar7->cent = cVar24 + bVar26;
    chunk_validate_objects((chunk_conflict *)pdVar7);
    pcVar8 = (chunk_conflict2 *)
             cave_new(*(wchar_t *)&pdVar7->ent,*(wchar_t *)((long)&pdVar7->ent + 4));
    p->cave = pcVar8;
    pcVar8->depth = *(wchar_t *)&pdVar7->field_0xc;
    ppoVar9 = (object **)mem_realloc(pcVar8->objects,(ulong)(ushort)pdVar7->block_hgt * 8 + 8);
    pcVar8 = p->cave;
    pcVar8->objects = ppoVar9;
    uVar28 = (ushort)pdVar7->block_hgt;
    pcVar8->obj_max = uVar28;
    for (uVar10 = 0; uVar10 <= uVar28; uVar10 = uVar10 + 1) {
      pcVar8->objects[uVar10] = (object *)0x0;
      pcVar8 = p->cave;
      uVar28 = pcVar8->obj_max;
    }
    if (p->upkeep->light_level == true) {
      wiz_light((chunk *)pdVar7,p,false);
      p->upkeep->light_level = false;
    }
  }
  else {
    event_signal_string(EVENT_GEN_LEVEL_START,"arena");
    pdVar7 = (dun_data *)arena_gen(p,height,width);
    pcVar8 = (chunk_conflict2 *)
             cave_new(*(wchar_t *)&pdVar7->ent,*(wchar_t *)((long)&pdVar7->ent + 4));
    p->cave = pcVar8;
    pcVar8->depth = *(wchar_t *)&pdVar7->field_0xc;
    ppoVar9 = (object **)mem_realloc(pcVar8->objects,(ulong)(ushort)pdVar7->block_hgt * 8 + 8);
    pcVar8 = p->cave;
    pcVar8->objects = ppoVar9;
    uVar27 = (uint16_t)pdVar7->block_hgt;
    pcVar8->obj_max = uVar27;
    for (uVar10 = 0; uVar10 <= uVar27; uVar10 = uVar10 + 1) {
      pcVar8->objects[uVar10] = (object *)0x0;
      pcVar8 = p->cave;
      uVar27 = pcVar8->obj_max;
    }
    wiz_light((chunk *)pdVar7,p,false);
  }
  pdVar7->cent_n = turn;
  return (chunk *)pdVar7;
}

Assistant:

static struct chunk *cave_generate(struct player *p, int height, int width)
{
	const char *error = "no generation";
	int i, tries = 0;
	struct chunk *chunk = NULL;

	/* Arena levels handled separately */
	if (p->upkeep->arena_level) {
		/* Generate level */
		event_signal_string(EVENT_GEN_LEVEL_START, "arena");
		chunk = arena_gen(p, height, width);

		/* Allocate new known level, light it if requested */
		p->cave = cave_new(chunk->height, chunk->width);
		p->cave->depth = chunk->depth;
		p->cave->objects = mem_realloc(p->cave->objects, (chunk->obj_max + 1)
									   * sizeof(struct object*));
		p->cave->obj_max = chunk->obj_max;
		for (i = 0; i <= p->cave->obj_max; i++) {
			p->cave->objects[i] = NULL;
		}

		wiz_light(chunk, p, false);
		chunk->turn = turn;

		return chunk;
	}

	/* Generate */
	for (tries = 0; tries < 100 && error; tries++) {
		int y, x;
		struct dun_data dun_body;

		error = NULL;

		/* Mark the dungeon as being unready (to avoid artifact loss, etc) */
		character_dungeon = false;

		/* Allocate global data (will be freed when we leave the loop) */
		dun = &dun_body;
		dun->cent = mem_zalloc(z_info->level_room_max * sizeof(struct loc));
		dun->ent_n = mem_zalloc(z_info->level_room_max * sizeof(*dun->ent_n));
		dun->ent = mem_zalloc(z_info->level_room_max * sizeof(*dun->ent));
		dun->ent2room = NULL;
		dun->door = mem_zalloc(z_info->level_door_max * sizeof(struct loc));
		dun->wall = mem_zalloc(z_info->wall_pierce_max * sizeof(struct loc));
		dun->tunn = mem_zalloc(z_info->tunn_grid_max * sizeof(struct loc));
		dun->join = NULL;
		dun->one_off_above = NULL;
		dun->one_off_below = NULL;
		dun->curr_join = NULL;
		dun->nstair_room = 0;
		dun->quest = is_quest(p, p->depth);

		/* Get connector info for persistent levels */
		if (OPT(p, birth_levels_persist)) {
			dun->persist = true;
			get_join_info(p, dun);
		} else {
			dun->persist = false;
		}


		/* Choose a profile and build the level */
		dun->profile = choose_profile(p);
		event_signal_string(EVENT_GEN_LEVEL_START, dun->profile->name);
		chunk = dun->profile->builder(p, height, width, &error);
		if (!chunk) {
			if (!error) {
				error = "unspecified level builder failure";
			}
			if (OPT(p, cheat_room)) {
				msg("Generation restarted: %s.", error);
			}
			cleanup_dun_data(dun);
			event_signal_flag(EVENT_GEN_LEVEL_END, false);
			continue;
		}

		/* Ensure quest monsters */
		if (dun->quest) {
			for (i = 0; i < z_info->quest_max; i++) {
				struct quest *q = &player->quests[i];
				struct monster_group_info info = { 0, 0 };
				struct loc grid;

				if (q->level != chunk->depth) continue;

				/* If the quest monster is unique and has already been placed, don't place again */
				if (rf_has(q->race->flags, RF_UNIQUE) && q->race->cur_num > 0) continue;

				/* Pick a location and place the monster(s) */
				for (int n = 0; n < q->max_num; n++) {
					find_empty(chunk, &grid);
					place_new_monster(chunk, grid, q->race, true, true, info,
									  ORIGIN_DROP);
				}
			}
		}

		/* Clear generation flags, add connecting info */
		for (y = 0; y < chunk->height; y++) {
			for (x = 0; x < chunk->width; x++) {
				struct loc grid = loc(x, y);

				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_INNER);
				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_OUTER);
				sqinfo_off(square(chunk, grid)->info, SQUARE_WALL_SOLID);
				sqinfo_off(square(chunk, grid)->info, SQUARE_MON_RESTRICT);

				if (square_isstairs(chunk, grid)) {
					size_t n;
					struct connector *new = mem_zalloc(sizeof *new);
					new->grid = grid;
					new->feat = square_feat(chunk, grid)->fidx;
					new->info = mem_zalloc(SQUARE_SIZE * sizeof(bitflag));
					for (n = 0; n < SQUARE_SIZE; n++) {
						new->info[n] = square(chunk, grid)->info[n];
					}
					new->next = chunk->join;
					chunk->join = new;
				}
			}
		}

		/* Regenerate levels that overflow their maxima */
		if (cave_monster_max(chunk) >= z_info->level_monster_max)
			error = "too many monsters";

		if (error) {
			if (OPT(p, cheat_room)) {
				msg("Generation restarted: %s.", error);
			}
			uncreate_artifacts(chunk);
			cave_clear(chunk, p);
			event_signal_flag(EVENT_GEN_LEVEL_END, false);
		}

		cleanup_dun_data(dun);
	}

	if (error) quit_fmt("cave_generate() failed 100 times!");

	/* Place dungeon squares to trigger feeling (not in town) */
	if (p->depth) {
		place_feeling(chunk);
	}

	chunk->feeling = calc_obj_feeling(chunk, p) + calc_mon_feeling(chunk);

	/* Validate the dungeon (we could use more checks here) */
	chunk_validate_objects(chunk);

	/* Allocate new known level, light it if requested */
	p->cave = cave_new(chunk->height, chunk->width);
	p->cave->depth = chunk->depth;
	p->cave->objects = mem_realloc(p->cave->objects, (chunk->obj_max + 1)
								   * sizeof(struct object*));
	p->cave->obj_max = chunk->obj_max;
	for (i = 0; i <= p->cave->obj_max; i++) {
		p->cave->objects[i] = NULL;
	}
	if (p->upkeep->light_level) {
		wiz_light(chunk, p, false);
		p->upkeep->light_level = false;
	}

	chunk->turn = turn;

	return chunk;
}